

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netrc.c
# Opt level: O2

int Curl_parsenetrc(store_netrc *store,char *host,char **loginp,char **passwordp,char *netrcfile)

{
  int iVar1;
  __uid_t __uid;
  char *pcVar2;
  char *pcVar3;
  passwd *pw_res;
  passwd pw;
  char pwbuf [1024];
  
  if (netrcfile != (char *)0x0) {
    iVar1 = parsenetrc(store,host,loginp,passwordp,netrcfile);
    return iVar1;
  }
  pcVar2 = curl_getenv("HOME");
  pcVar3 = pcVar2;
  if (pcVar2 == (char *)0x0) {
    __uid = geteuid();
    iVar1 = getpwuid_r(__uid,(passwd *)&pw,pwbuf,0x400,(passwd **)&pw_res);
    pcVar3 = pw.pw_dir;
    if ((pw.pw_dir == (char *)0x0 || pw_res == (passwd *)0x0) || iVar1 != 0) {
      return 1;
    }
  }
  pcVar3 = curl_maprintf("%s%s.netrc",pcVar3,"/");
  if (pcVar3 == (char *)0x0) {
    (*Curl_cfree)(pcVar2);
    iVar1 = -1;
  }
  else {
    iVar1 = parsenetrc(store,host,loginp,passwordp,pcVar3);
    (*Curl_cfree)(pcVar3);
    (*Curl_cfree)(pcVar2);
  }
  return iVar1;
}

Assistant:

int Curl_parsenetrc(struct store_netrc *store, const char *host,
                    char **loginp, char **passwordp,
                    char *netrcfile)
{
  int retcode = 1;
  char *filealloc = NULL;

  if(!netrcfile) {
#if defined(HAVE_GETPWUID_R) && defined(HAVE_GETEUID)
    char pwbuf[1024];
#endif
    char *home = NULL;
    char *homea = curl_getenv("HOME"); /* portable environment reader */
    if(homea) {
      home = homea;
#if defined(HAVE_GETPWUID_R) && defined(HAVE_GETEUID)
    }
    else {
      struct passwd pw, *pw_res;
      if(!getpwuid_r(geteuid(), &pw, pwbuf, sizeof(pwbuf), &pw_res)
         && pw_res) {
        home = pw.pw_dir;
      }
#elif defined(HAVE_GETPWUID) && defined(HAVE_GETEUID)
    }
    else {
      struct passwd *pw;
      pw = getpwuid(geteuid());
      if(pw) {
        home = pw->pw_dir;
      }
#elif defined(_WIN32)
    }
    else {
      homea = curl_getenv("USERPROFILE");
      if(homea) {
        home = homea;
      }
#endif
    }

    if(!home)
      return retcode; /* no home directory found (or possibly out of
                         memory) */

    filealloc = aprintf("%s%s.netrc", home, DIR_CHAR);
    if(!filealloc) {
      free(homea);
      return -1;
    }
    retcode = parsenetrc(store, host, loginp, passwordp, filealloc);
    free(filealloc);
#ifdef _WIN32
    if(retcode == NETRC_FILE_MISSING) {
      /* fallback to the old-style "_netrc" file */
      filealloc = aprintf("%s%s_netrc", home, DIR_CHAR);
      if(!filealloc) {
        free(homea);
        return -1;
      }
      retcode = parsenetrc(store, host, loginp, passwordp, filealloc);
      free(filealloc);
    }
#endif
    free(homea);
  }